

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::visit(FunctionResolver *this,CallOrCast *call)

{
  size_t *psVar1;
  pool_ptr<soul::AST::CommaSeparatedList> *this_00;
  bool *pbVar2;
  Allocator *pAVar3;
  Allocator *allocator;
  pointer pPVar4;
  long *plVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  TypeCast *pTVar9;
  QualifiedIdentifier *pQVar10;
  Expression *pEVar11;
  CommaSeparatedList *pCVar12;
  StaticAssertion *pSVar13;
  PossibleFunction *pPVar14;
  difference_type dVar15;
  CallOrCast *pCVar16;
  pool_ref<soul::AST::Expression> *ppVar17;
  CallOrCast *pCVar18;
  difference_type dVar19;
  size_t sVar20;
  Type *pTVar21;
  pool_ref<soul::AST::Function> *extraout_RDX;
  pool_ref<soul::AST::Function> *extraout_RDX_00;
  pool_ref<soul::AST::Function> *extraout_RDX_01;
  pool_ref<soul::AST::Function> *ppVar22;
  pool_ref<soul::AST::Function> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  pool_ref<soul::AST::Expression> *in_R8;
  PossibleFunction *f;
  long lVar23;
  CallOrCast *call_00;
  ulong index;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions_00;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> args_01;
  pool_ptr<soul::AST::QualifiedIdentifier> name;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> possibles;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> functions;
  pool_ptr<soul::AST::Expression> resolved;
  ulong local_228;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> matchingGenerics;
  pool_ref<soul::AST::Expression> local_120;
  Type local_118;
  string local_100;
  string local_e0;
  string local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,call);
  pEVar11 = (call->nameOrType).object;
  if ((pEVar11->kind == type) &&
     (iVar8 = (*(pEVar11->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar8 != '\0')) {
    pAVar3 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    (*(((call->nameOrType).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&local_118)
    ;
    pTVar9 = convertToCast(pAVar3,call,&local_118);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_118.structure);
    return &pTVar9->super_Expression;
  }
  bVar6 = AST::CallOrCastBase::areAllArgumentsResolved(&call->super_CallOrCastBase);
  if (bVar6) {
    local_120.object = (call->nameOrType).object;
    cast<soul::AST::QualifiedIdentifier,soul::AST::Expression>((soul *)&name,&local_120);
    if (name.object != (QualifiedIdentifier *)0x0) {
      pQVar10 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
      AST::QualifiedIdentifier::getPath((IdentifierPath *)&resolved,pQVar10);
      bVar6 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&resolved,"advance");
      ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&resolved);
      if (bVar6) {
        pEVar11 = createAdvanceCall(this,call);
        return pEVar11;
      }
      pQVar10 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
      AST::QualifiedIdentifier::getPath((IdentifierPath *)&resolved,pQVar10);
      bVar6 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&resolved,"static_assert");
      ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&resolved);
      if (bVar6) {
        pAVar3 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        pCVar12 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                            (&(call->super_CallOrCastBase).arguments);
        allocator = (Allocator *)(pCVar12->items).items;
        args_01.e = in_R8;
        args_01.s = (pool_ref<soul::AST::Expression> *)
                    (&(allocator->pool).pools.
                      super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (pCVar12->items).numActive);
        pSVar13 = ASTUtilities::createStaticAssertion
                            ((ASTUtilities *)
                             &(call->super_CallOrCastBase).super_Expression.super_Statement.
                              super_ASTObject.context,(Context *)pAVar3,allocator,args_01);
        return &pSVar13->super_Expression;
      }
      pQVar10 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
      AST::QualifiedIdentifier::getPath((IdentifierPath *)&resolved,pQVar10);
      bVar6 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&resolved,"at");
      ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&resolved);
      if (bVar6) {
        pEVar11 = createAtCall(this,call);
        return pEVar11;
      }
      pQVar10 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
      pPVar4 = (pQVar10->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((long)(pQVar10->pathSections).
                 super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 == 0x60) &&
         ((pPVar4->specialisationArgs).object == (Expression *)0x0)) {
        this_00 = &(call->super_CallOrCastBase).arguments;
        if ((call->super_CallOrCastBase).arguments.object != (CommaSeparatedList *)0x0) {
          pCVar12 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
          ppVar17 = (pCVar12->items).items;
          sVar20 = (pCVar12->items).numActive;
          for (lVar23 = 0; sVar20 << 3 != lVar23; lVar23 = lVar23 + 8) {
            plVar5 = *(long **)((long)&ppVar17->object + lVar23);
            if (((int)plVar5[5] != 0) || (cVar7 = (**(code **)(*plVar5 + 0x18))(), cVar7 == '\0')) {
              if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors != false)
              goto LAB_00223ebc;
              SanityCheckPass::throwErrorIfNotReadableValue
                        (*(Expression **)((long)&ppVar17->object + lVar23));
            }
          }
        }
        pQVar10 = pool_ptr<soul::AST::QualifiedIdentifier>::operator*(&name);
        findAllPossibleFunctions(&possibles,this,call,pQVar10);
        pCVar16 = (CallOrCast *)possibles.numActive;
        lVar23 = possibles.numActive << 4;
        pPVar14 = possibles.items;
LAB_00223f5a:
        if (lVar23 != 0) goto code_r0x00223f5f;
        bVar6 = SUB81(call,0);
        if ((possibles.numActive == 1) &&
           (pPVar14 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                      ::front(&possibles), pPVar14->isImpossible != true)) {
          pCVar18 = (CallOrCast *)
                    ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                    ::front(&possibles);
          resolveFunction((FunctionResolver *)&resolved,(PossibleFunction *)this,pCVar18,bVar6);
          if (resolved.object != (Expression *)0x0) {
            pCVar16 = (CallOrCast *)pool_ptr<soul::AST::Expression>::operator*(&resolved);
          }
          goto LAB_00224141;
        }
        dVar15 = std::
                 __count_if<soul::ResolutionPass::FunctionResolver::PossibleFunction*,__gnu_cxx::__ops::_Iter_pred<soul::ResolutionPass::FunctionResolver::countNumberOfExactMatches(soul::ArrayView<soul::ResolutionPass::FunctionResolver::PossibleFunction>)::_lambda(soul::ResolutionPass::FunctionResolver::PossibleFunction_const&)_1_>>
                           (possibles.items,possibles.items + possibles.numActive);
        if (dVar15 == 1) {
          lVar23 = possibles.numActive << 4;
          while( true ) {
            if (lVar23 == 0) {
              throwInternalCompilerError("visit",0x900);
            }
            if ((((char)(((CallOrCast *)possibles.items)->super_CallOrCastBase).super_Expression.
                        super_Statement.super_ASTObject.objectType == Graph) &&
                (*(byte *)((long)&(((CallOrCast *)possibles.items)->super_CallOrCastBase).
                                  super_Expression.super_Statement.super_ASTObject.objectType + 1)
                 == 0)) &&
               (*(byte *)((long)&(((CallOrCast *)possibles.items)->super_CallOrCastBase).
                                 super_Expression.super_Statement.super_ASTObject.objectType + 2) ==
                0)) break;
            possibles.items =
                 (PossibleFunction *)
                 &(((CallOrCast *)possibles.items)->super_CallOrCastBase).super_Expression.
                  super_Statement.super_ASTObject.context;
            lVar23 = lVar23 + -0x10;
          }
          resolveFunction((FunctionResolver *)&resolved,(PossibleFunction *)this,
                          (CallOrCast *)possibles.items,bVar6);
          if (resolved.object != (Expression *)0x0) {
            pCVar16 = (CallOrCast *)pool_ptr<soul::AST::Expression>::operator*(&resolved);
          }
LAB_00224141:
          pCVar18 = pCVar16;
          if (resolved.object == (Expression *)0x0) {
            pCVar18 = call;
          }
          bVar6 = false;
          goto LAB_002241c8;
        }
        matchingGenerics.items = (pool_ref<soul::AST::Expression> *)matchingGenerics.space;
        matchingGenerics.numActive = 0;
        matchingGenerics.numAllocated = 4;
        lVar23 = possibles.numActive << 4;
        pCVar18 = (CallOrCast *)0x1;
        call_00 = (CallOrCast *)possibles.items;
        goto LAB_00224029;
      }
    }
  }
  goto LAB_00223ebc;
code_r0x00223f5f:
  lVar23 = lVar23 + -0x10;
  pbVar2 = &pPVar14->functionIsNotResolved;
  pPVar14 = pPVar14 + 1;
  if (*pbVar2 != false) goto code_r0x00223f6d;
  goto LAB_00223f5a;
code_r0x00223f6d:
  bVar6 = false;
  pCVar18 = call;
  goto LAB_002241c8;
LAB_00224029:
  if (lVar23 == 0) goto LAB_002240d8;
  if (((char)(call_00->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
             objectType == Graph) &&
     (*(byte *)((long)&(call_00->super_CallOrCastBase).super_Expression.super_Statement.
                       super_ASTObject.objectType + 2) == 1)) {
    resolveFunction((FunctionResolver *)&resolved,(PossibleFunction *)this,call_00,bVar6);
    if (resolved.object == (Expression *)0x0) {
      iVar8 = (*(this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.
                _vptr_RewritingASTVisitor[0x38])(this);
      if ((char)iVar8 == '\0') {
        bVar6 = false;
        pCVar18 = call;
        goto LAB_002241bb;
      }
    }
    else {
      functions.items =
           (pool_ref<soul::AST::Function> *)pool_ptr<soul::AST::Expression>::operator*(&resolved);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (&matchingGenerics,(pool_ref<soul::AST::Expression> *)&functions);
    }
  }
  call_00 = (CallOrCast *)
            &(call_00->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
             context;
  lVar23 = lVar23 + -0x10;
  goto LAB_00224029;
LAB_002240d8:
  if (matchingGenerics.numActive == 1) {
    ppVar17 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::front
                        (&matchingGenerics);
    bVar6 = false;
    pCVar18 = (CallOrCast *)ppVar17->object;
  }
  else {
    bVar6 = true;
    if ((matchingGenerics.numActive != 0) ||
       ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false)) {
      if (pCVar16 == (CallOrCast *)0x0) {
        pQVar10 = pool_ptr<soul::AST::QualifiedIdentifier>::operator*(&name);
        throwErrorForUnknownFunction(this,call,pQVar10);
      }
      dVar19 = std::
               __count_if<soul::ResolutionPass::FunctionResolver::PossibleFunction*,__gnu_cxx::__ops::_Iter_pred<soul::ResolutionPass::FunctionResolver::countNumberOfMatchesWithCast(soul::ArrayView<soul::ResolutionPass::FunctionResolver::PossibleFunction>)::_lambda(soul::ResolutionPass::FunctionResolver::PossibleFunction_const&)_1_>>
                         (possibles.items,possibles.items + possibles.numActive);
      ppVar22 = extraout_RDX;
      if (dVar15 + dVar19 == 0) {
        if (pCVar16 == (CallOrCast *)0x1) {
          pPVar14 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                    ::front(&possibles);
          if (pPVar14->requiresGeneric != false) {
            ppVar22 = extraout_RDX_00;
            if (1 < matchingGenerics.numActive) goto LAB_0022436b;
            goto LAB_00224451;
          }
          pPVar14 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                    ::front(&possibles);
          AST::Function::getParameterTypes((TypeArray *)&resolved,pPVar14->function);
          sVar20 = AST::CallOrCastBase::getNumArguments(&call->super_CallOrCastBase);
          if (local_228 != sVar20) {
            throwInternalCompilerError("paramTypes.size() == call.getNumArguments()","visit",0x920);
          }
          for (index = 0; index < local_228; index = index + 1) {
            pTVar21 = ArrayWithPreallocation<soul::Type,_8UL>::operator[]
                                ((ArrayWithPreallocation<soul::Type,_8UL> *)&resolved,index);
            pCVar12 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
            ppVar17 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                                (&pCVar12->items,index);
            (*(ppVar17->object->super_Statement).super_ASTObject._vptr_ASTObject[4])(&functions);
            bVar6 = TypeRules::canPassAsArgumentTo(pTVar21,(Type *)&functions,true);
            RefCountedPtr<soul::Structure>::~RefCountedPtr
                      ((RefCountedPtr<soul::Structure> *)&functions.numAllocated);
            if (!bVar6) {
              pCVar12 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
              ppVar17 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
                        operator[](&pCVar12->items,index);
              pEVar11 = ppVar17->object;
              pTVar21 = ArrayWithPreallocation<soul::Type,_8UL>::operator[]
                                  ((ArrayWithPreallocation<soul::Type,_8UL> *)&resolved,index);
              pCVar12 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
              ppVar17 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
                        operator[](&pCVar12->items,index);
              SanityCheckPass::expectSilentCastPossible
                        (&(pEVar11->super_Statement).super_ASTObject.context,pTVar21,ppVar17->object
                        );
            }
          }
          ArrayWithPreallocation<soul::Type,_8UL>::clear
                    ((ArrayWithPreallocation<soul::Type,_8UL> *)&resolved);
          ppVar22 = extraout_RDX_01;
        }
        if ((pCVar16 == (CallOrCast *)0x0) || (matchingGenerics.numActive < 2)) {
LAB_00224451:
          pQVar10 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
          AST::QualifiedIdentifier::getPath((IdentifierPath *)&resolved,pQVar10);
          IdentifierPath::toString_abi_cxx11_(&local_c0,(IdentifierPath *)&resolved);
          AST::CallOrCastBase::getDescription
                    ((string *)&functions,&call->super_CallOrCastBase,&local_c0);
          Errors::noMatchForFunctionCall<std::__cxx11::string>
                    (&local_68,(Errors *)&functions,args_00);
          AST::Context::throwError
                    (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                      context,&local_68,false);
        }
LAB_0022436b:
        functions.items = (pool_ref<soul::AST::Function> *)functions.space;
        functions.numActive = 0;
        functions.numAllocated = 4;
        for (lVar23 = 0; possibles.numActive << 4 != lVar23; lVar23 = lVar23 + 0x10) {
          resolved.object = *(Expression **)((long)&(possibles.items)->function + lVar23);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL>::push_back
                    (&functions,(pool_ref<soul::AST::Function> *)&resolved);
          ppVar22 = extraout_RDX_02;
        }
        functions_00.e = ppVar22;
        functions_00.s = functions.items + functions.numActive;
        SanityCheckPass::checkForDuplicateFunctions((SanityCheckPass *)functions.items,functions_00)
        ;
        pQVar10 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
        AST::QualifiedIdentifier::getPath((IdentifierPath *)&resolved,pQVar10);
        IdentifierPath::toString_abi_cxx11_(&local_100,(IdentifierPath *)&resolved);
        AST::CallOrCastBase::getDescription(&local_e0,&call->super_CallOrCastBase,&local_100);
        Errors::ambiguousFunctionCall<std::__cxx11::string>(&local_a0,(Errors *)&local_e0,args);
        AST::Context::throwError
                  (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                    context,&local_a0,false);
      }
      if ((1 < pCVar16) || (pCVar18 = pCVar16, 1 < matchingGenerics.numActive)) goto LAB_0022436b;
    }
  }
LAB_002241bb:
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear(&matchingGenerics);
LAB_002241c8:
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::clear
            (&possibles);
  if (bVar6) {
LAB_00223ebc:
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
    pCVar18 = call;
  }
  return (Expression *)pCVar18;
}

Assistant:

AST::Expression& visit (AST::CallOrCast& call) override
        {
            super::visit (call);

            if (AST::isResolvedAsType (call.nameOrType.get()))
                return convertToCast (allocator, call, call.nameOrType->resolveAsType());

            if (call.areAllArgumentsResolved())
            {
                if (auto name = cast<AST::QualifiedIdentifier> (call.nameOrType))
                {
                    if (name->getPath().isUnqualifiedName ("advance"))
                        return createAdvanceCall (call);

                    if (name->getPath().isUnqualifiedName ("static_assert"))
                        return ASTUtilities::createStaticAssertion (call.context, allocator, call.arguments->items);

                    if (name->getPath().isUnqualifiedName ("at"))
                        return createAtCall (call);

                    if (! name->isSimplePath())
                    {
                        numFails++;
                        return call;
                    }

                    if (call.arguments != nullptr)
                    {
                        for (auto& arg : call.arguments->items)
                        {
                            if (! AST::isResolvedAsValue (arg.get()))
                            {
                                if (ignoreErrors)
                                {
                                    ++numFails;
                                    return call;
                                }

                                SanityCheckPass::throwErrorIfNotReadableValue (arg);
                            }
                        }
                    }

                    auto possibles = findAllPossibleFunctions (call, *name);

                    for (auto& f : possibles)
                        if (f.functionIsNotResolved)
                            return call;

                    auto totalMatches = possibles.size();

                    // If there's only one function found, and we can call it (maybe with a cast), then go for it..
                    if (totalMatches == 1 && ! possibles.front().isImpossible)
                    {
                        if (auto resolved = resolveFunction (possibles.front(), call, ignoreErrors))
                            return *resolved;

                        return call;
                    }

                    auto exactMatches = countNumberOfExactMatches (possibles);

                    // If there's one exact match, then even if there are others requiring casts, we'll ignore them
                    // and go for the one which is a perfect match..
                    if (exactMatches == 1)
                    {
                        for (auto& f : possibles)
                        {
                            if (f.isExactMatch())
                            {
                                if (auto resolved = resolveFunction (f, call, ignoreErrors))
                                    return *resolved;

                                return call;
                            }
                        }

                        SOUL_ASSERT_FALSE;
                    }

                    // If there are any generic functions, see if exactly one of these works
                    ArrayWithPreallocation<pool_ref<AST::Expression>, 4> matchingGenerics;

                    for (auto& f : possibles)
                    {
                        if (! f.isImpossible && f.requiresGeneric)
                        {
                            if (auto e = resolveFunction (f, call, true))
                                matchingGenerics.push_back (*e);
                            else if (! canResolveGenerics())
                                return call;
                        }
                    }

                    if (matchingGenerics.size() == 1)
                        return matchingGenerics.front();

                    if (! ignoreErrors || matchingGenerics.size() > 1)
                    {
                        if (totalMatches == 0)
                            throwErrorForUnknownFunction (call, *name);

                        auto possibleWithCast = countNumberOfMatchesWithCast (possibles);

                        if (exactMatches + possibleWithCast == 0)
                        {
                            if (totalMatches == 1 && ! possibles.front().requiresGeneric)
                            {
                                auto paramTypes = possibles.front().function.getParameterTypes();
                                SOUL_ASSERT (paramTypes.size() == call.getNumArguments());

                                for (size_t i = 0; i < paramTypes.size(); ++i)
                                    if (! TypeRules::canPassAsArgumentTo (paramTypes[i], call.arguments->items[i]->getResultType(), true))
                                        SanityCheckPass::expectSilentCastPossible (call.arguments->items[i]->context,
                                                                                   paramTypes[i], call.arguments->items[i]);
                            }

                            if (totalMatches == 0 || matchingGenerics.size() <= 1)
                                call.context.throwError (Errors::noMatchForFunctionCall (call.getDescription (name->getPath().toString())));
                        }

                        if (totalMatches > 1 || matchingGenerics.size() > 1)
                        {
                            ArrayWithPreallocation<pool_ref<AST::Function>, 4> functions;

                            for (auto& f : possibles)
                                functions.push_back (f.function);

                            SanityCheckPass::checkForDuplicateFunctions (functions);

                            call.context.throwError (Errors::ambiguousFunctionCall (call.getDescription (name->getPath().toString())));
                        }
                    }
                }
            }

            ++numFails;
            return call;
        }